

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

get_result * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (get_result *__return_storage_ptr__,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  uintptr_t uVar4;
  find_result fVar5;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_38;
  
  uVar4 = (this->root).tagged_ptr;
  if (uVar4 == 0) {
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>)._M_payload
    .super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_engaged =
         false;
  }
  else {
    local_38 = k.field_0;
    while( true ) {
      this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(uVar4 & 0xfffffffffffffff8);
      if ((uVar4 & 7) == 0) break;
      bVar1 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                        *)this_00);
      uVar3 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)this_00,local_38.key);
      if (uVar3 < bVar1) goto LAB_00167bd5;
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&local_38.key_bytes,(ulong)bVar1);
      fVar5 = detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::find_child(this_00,(node_type)uVar4 & (I256|I48),local_38.key_bytes._M_elems[0]);
      if (fVar5.second ==
          (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
          0x0) goto LAB_00167bd5;
      uVar4 = ((fVar5.second)->value).tagged_ptr;
      local_38.key = local_38.key >> 8;
    }
    bVar2 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::matches
                      ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)this_00,
                       (art_key_type)k.field_0);
    if (bVar2) {
      uVar3 = *(uint *)((long)&this_00->k_prefix + 4);
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr = &(&this_00->children_count)[*(uint *)&this_00->k_prefix].value;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                        )._M_payload.
                        super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                        ._M_payload + 8) = (ulong)uVar3;
      bVar2 = true;
    }
    else {
LAB_00167bd5:
      bVar2 = false;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>)._M_payload
    .super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_engaged =
         bVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}